

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.cpp
# Opt level: O0

ostream * operator<<(ostream *os,vec3f *v)

{
  ostream *poVar1;
  vec3f *v_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,'(');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v->x);
  poVar1 = std::operator<<(poVar1,',');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v->y);
  poVar1 = std::operator<<(poVar1,',');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v->z);
  poVar1 = std::operator<<(poVar1,')');
  return poVar1;
}

Assistant:

std::ostream& operator << (std::ostream& os, const vec3f& v) {
	return os << '(' << v.x << ',' << v.y << ',' << v.z << ')';
}